

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void runN(Benchmark *b,int n,int siz)

{
  int64 iVar1;
  
  bytes = 0;
  ns = 0;
  t0 = nsec();
  if (b->fn == (_func_void_int *)0x0) {
    if (b->fnr == (_func_void_int_int *)0x0) {
      fprintf(_stderr,"%s: missing function\n",b->name);
      exit(2);
    }
    (*b->fnr)(n,siz);
  }
  else {
    (*b->fn)(n);
  }
  if (t0 != 0) {
    iVar1 = nsec();
    ns = ns + (iVar1 - t0);
  }
  return;
}

Assistant:

static void runN(Benchmark *b, int n, int siz) {
	bytes = 0;
	items = 0;
	ns = 0;
	t0 = nsec();
	if(b->fn)
		b->fn(n);
	else if(b->fnr)
		b->fnr(n, siz);
	else {
		fprintf(stderr, "%s: missing function\n", b->name);
		exit(2);
	}
	if(t0 != 0)
		ns += nsec() - t0;
}